

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<DomAction_const*,QString>::findImpl<DomAction_const*>
          (QHash<const_DomAction_*,_QString> *this,DomAction **key)

{
  piter it_00;
  bool bVar1;
  size_t bucket_00;
  QHash<const_DomAction_*,_QString> *in_RDI;
  long in_FS_OFFSET;
  size_t bucket;
  Bucket it;
  Data<QHashPrivate::Node<const_DomAction_*,_QString>_> *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<const_DomAction_*,_QString>_> *in_stack_ffffffffffffff90;
  Data<QHashPrivate::Node<const_DomAction_*,_QString>_> *in_stack_ffffffffffffffa0;
  Bucket local_38;
  Bucket local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<const_DomAction_*,_QString>::isEmpty(in_RDI);
  if (bVar1) {
    local_18 = (piter)QHash<const_DomAction_*,_QString>::end(in_RDI);
  }
  else {
    local_28.index = 0xaaaaaaaaaaaaaaaa;
    local_28.span = (Span *)0xaaaaaaaaaaaaaaaa;
    local_28 = QHashPrivate::Data<QHashPrivate::Node<DomAction_const*,QString>>::
               findBucket<DomAction_const*>(in_stack_ffffffffffffffa0,(DomAction **)in_RDI);
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<const_DomAction_*,_QString>_>::Bucket::
                toBucketIndex(&local_28,in_RDI->d);
    QHash<const_DomAction_*,_QString>::detach
              ((QHash<const_DomAction_*,_QString> *)in_stack_ffffffffffffff90);
    QHashPrivate::Data<QHashPrivate::Node<const_DomAction_*,_QString>_>::Bucket::Bucket
              (&local_38,in_RDI->d,bucket_00);
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<const_DomAction_*,_QString>_>::Bucket::isUnused
                      ((Bucket *)0x1826ab);
    if (bVar1) {
      local_18 = (piter)QHash<const_DomAction_*,_QString>::end(in_RDI);
    }
    else {
      QHashPrivate::Data<QHashPrivate::Node<const_DomAction_*,_QString>_>::Bucket::toIterator
                ((Bucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      it_00.bucket = (size_t)in_RDI;
      it_00.d = in_stack_ffffffffffffff90;
      QHash<const_DomAction_*,_QString>::iterator::iterator
                ((iterator *)in_stack_ffffffffffffff88,it_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_18;
  }
  __stack_chk_fail();
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }